

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeViewport(ImGuiViewportP *viewport)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  void *ptr_id;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  ImVector<ImDrawList_*> *pIVar19;
  char *pcVar20;
  long lVar21;
  float fVar22;
  float fVar23;
  
  SetNextItemOpen(true,2);
  ptr_id = (void *)(ulong)(viewport->super_ImGuiViewport).ID;
  if (viewport->Window == (ImGuiWindow *)0x0) {
    pcVar8 = "N/A";
  }
  else {
    pcVar8 = viewport->Window->Name;
  }
  bVar6 = TreeNode(ptr_id,"Viewport #%d, ID: 0x%08X, Parent: 0x%08X, Window: \"%s\"",
                   (ulong)*(uint *)&(viewport->super_ImGuiViewport).field_0x5c,ptr_id,
                   (ulong)(viewport->super_ImGuiViewport).ParentViewportId,pcVar8);
  if (bVar6) {
    uVar3 = (viewport->super_ImGuiViewport).Flags;
    BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f\nMonitor: %d, DpiScale: %.0f%%"
               ,SUB84((double)(viewport->super_ImGuiViewport).Pos.x,0),
               (double)(viewport->super_ImGuiViewport).Pos.y,
               (double)(viewport->super_ImGuiViewport).Size.x,
               (double)(viewport->super_ImGuiViewport).Size.y,(double)(viewport->WorkOffsetMin).x,
               (double)(viewport->WorkOffsetMin).y,(double)(viewport->WorkOffsetMax).x,
               (double)(viewport->WorkOffsetMax).y,(ulong)(uint)(int)viewport->PlatformMonitor);
    pIVar5 = GImGui;
    if (0 < *(int *)&(viewport->super_ImGuiViewport).field_0x5c) {
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      if (pIVar4->SkipItems == false) {
        (pIVar4->DC).CursorPos.x = (pIVar5->Style).ItemSpacing.x + (pIVar4->DC).CursorPosPrevLine.x;
        (pIVar4->DC).CursorPos.y = (pIVar4->DC).CursorPosPrevLine.y;
        (pIVar4->DC).CurrLineSize = (pIVar4->DC).PrevLineSize;
        (pIVar4->DC).CurrLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
      }
      bVar6 = SmallButton("Reset Pos");
      if (bVar6) {
        (viewport->super_ImGuiViewport).Pos.x = 200.0;
        (viewport->super_ImGuiViewport).Pos.y = 200.0;
        fVar1 = (viewport->WorkOffsetMin).x;
        fVar2 = (viewport->WorkOffsetMin).y;
        fVar23 = ((viewport->super_ImGuiViewport).Size.x - fVar1) + (viewport->WorkOffsetMax).x;
        fVar22 = ((viewport->super_ImGuiViewport).Size.y - fVar2) + (viewport->WorkOffsetMax).y;
        (viewport->super_ImGuiViewport).WorkPos.x = fVar1 + 200.0;
        (viewport->super_ImGuiViewport).WorkPos.y = fVar2 + 200.0;
        (viewport->super_ImGuiViewport).WorkSize.x = (float)(~-(uint)(fVar23 <= 0.0) & (uint)fVar23)
        ;
        (viewport->super_ImGuiViewport).WorkSize.y = (float)(~-(uint)(fVar22 <= 0.0) & (uint)fVar22)
        ;
        if (viewport->Window != (ImGuiWindow *)0x0) {
          viewport->Window->Pos = (viewport->super_ImGuiViewport).Pos;
        }
      }
    }
    pcVar8 = " IsPlatformMonitor";
    if ((uVar3 & 2) == 0) {
      pcVar8 = "";
    }
    pcVar7 = " OwnedByApp";
    if ((uVar3 & 4) == 0) {
      pcVar7 = "";
    }
    pcVar13 = " NoDecoration";
    if ((uVar3 & 8) == 0) {
      pcVar13 = "";
    }
    pcVar14 = " NoTaskBarIcon";
    if ((uVar3 & 0x10) == 0) {
      pcVar14 = "";
    }
    pcVar11 = " NoFocusOnAppearing";
    if ((uVar3 & 0x20) == 0) {
      pcVar11 = "";
    }
    pcVar12 = " NoFocusOnClick";
    if ((uVar3 & 0x40) == 0) {
      pcVar12 = "";
    }
    pcVar20 = " NoInputs";
    if (-1 < (char)uVar3) {
      pcVar20 = "";
    }
    pcVar17 = " NoRendererClear";
    if ((uVar3 >> 8 & 1) == 0) {
      pcVar17 = "";
    }
    pcVar18 = " TopMost";
    if ((uVar3 >> 9 & 1) == 0) {
      pcVar18 = "";
    }
    pcVar16 = " Minimized";
    if ((uVar3 >> 10 & 1) == 0) {
      pcVar16 = "";
    }
    pcVar9 = " NoAutoMerge";
    if ((uVar3 >> 0xb & 1) == 0) {
      pcVar9 = "";
    }
    pcVar15 = " CanHostOtherWindows";
    if ((uVar3 >> 0xc & 1) == 0) {
      pcVar15 = "";
    }
    BulletText("Flags: 0x%04X =%s%s%s%s%s%s%s%s%s%s%s%s",
               (ulong)(uint)(viewport->super_ImGuiViewport).Flags,pcVar8,pcVar7,pcVar13,pcVar14,
               pcVar11,pcVar12,pcVar20,pcVar17,pcVar18,pcVar16,pcVar9,pcVar15);
    lVar21 = 0;
    do {
      if (0 < (viewport->DrawDataBuilder).Layers[lVar21].Size) {
        pIVar19 = (viewport->DrawDataBuilder).Layers + lVar21;
        lVar10 = 0;
        do {
          DebugNodeDrawList((ImGuiWindow *)0x0,viewport,pIVar19->Data[lVar10],"DrawList");
          lVar10 = lVar10 + 1;
        } while (lVar10 < pIVar19->Size);
      }
      bVar6 = lVar21 == 0;
      lVar21 = lVar21 + 1;
    } while (bVar6);
    TreePop();
    return;
  }
  return;
}

Assistant:

void ImGui::DebugNodeViewport(ImGuiViewportP* viewport)
{
    SetNextItemOpen(true, ImGuiCond_Once);
    if (TreeNode((void*)(intptr_t)viewport->ID, "Viewport #%d, ID: 0x%08X, Parent: 0x%08X, Window: \"%s\"", viewport->Idx, viewport->ID, viewport->ParentViewportId, viewport->Window ? viewport->Window->Name : "N/A"))
    {
        ImGuiWindowFlags flags = viewport->Flags;
        BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f\nMonitor: %d, DpiScale: %.0f%%",
            viewport->Pos.x, viewport->Pos.y, viewport->Size.x, viewport->Size.y,
            viewport->WorkOffsetMin.x, viewport->WorkOffsetMin.y, viewport->WorkOffsetMax.x, viewport->WorkOffsetMax.y,
            viewport->PlatformMonitor, viewport->DpiScale * 100.0f);
        if (viewport->Idx > 0) { SameLine(); if (SmallButton("Reset Pos")) { viewport->Pos = ImVec2(200, 200); viewport->UpdateWorkRect(); if (viewport->Window) viewport->Window->Pos = viewport->Pos; } }
        BulletText("Flags: 0x%04X =%s%s%s%s%s%s%s%s%s%s%s%s", viewport->Flags,
            //(flags & ImGuiViewportFlags_IsPlatformWindow) ? " IsPlatformWindow" : "", // Omitting because it is the standard
            (flags & ImGuiViewportFlags_IsPlatformMonitor) ? " IsPlatformMonitor" : "",
            (flags & ImGuiViewportFlags_OwnedByApp) ? " OwnedByApp" : "",
            (flags & ImGuiViewportFlags_NoDecoration) ? " NoDecoration" : "",
            (flags & ImGuiViewportFlags_NoTaskBarIcon) ? " NoTaskBarIcon" : "",
            (flags & ImGuiViewportFlags_NoFocusOnAppearing) ? " NoFocusOnAppearing" : "",
            (flags & ImGuiViewportFlags_NoFocusOnClick) ? " NoFocusOnClick" : "",
            (flags & ImGuiViewportFlags_NoInputs) ? " NoInputs" : "",
            (flags & ImGuiViewportFlags_NoRendererClear) ? " NoRendererClear" : "",
            (flags & ImGuiViewportFlags_TopMost) ? " TopMost" : "",
            (flags & ImGuiViewportFlags_Minimized) ? " Minimized" : "",
            (flags & ImGuiViewportFlags_NoAutoMerge) ? " NoAutoMerge" : "",
            (flags & ImGuiViewportFlags_CanHostOtherWindows) ? " CanHostOtherWindows" : "");
        for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
            for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                DebugNodeDrawList(NULL, viewport, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        TreePop();
    }
}